

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JESPtype.cpp
# Opt level: O1

string * __thiscall
JESPtype::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,JESPtype *this,JESP_t type)

{
  E *this_00;
  undefined4 in_register_00000014;
  char *pcVar1;
  char *pcVar2;
  
  if ((int)this == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "JESPDP";
    pcVar1 = "";
  }
  else {
    if ((int)this != 0) {
      this_00 = (E *)__cxa_allocate_exception(0x28,this,CONCAT44(in_register_00000014,type));
      E::E(this_00,"JESPtype::SoftPrint invalid type");
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "JESPExh";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string JESPtype::SoftPrint(JESP_t type)
{
    switch(type)
    {
    case JESPExhaustive:
        return("JESPExh");
        break;
    case JESPDP:
        return("JESPDP");
        break;
    }

    throw(E("JESPtype::SoftPrint invalid type"));

    return("INVALID_JESP_TYPE");
}